

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void save(LexerState *ls,int c)

{
  TextBuffer *mb;
  size_t sVar1;
  size_t sVar2;
  size_t oldsize;
  size_t newsize;
  TextBuffer *b;
  int c_local;
  LexerState *ls_local;
  
  mb = ls->buff;
  sVar1 = raviX_buffer_len(mb);
  sVar2 = raviX_buffer_size(mb);
  if (sVar2 < sVar1 + 1) {
    sVar1 = raviX_buffer_size(mb);
    if (0x3ffffffe < sVar1) {
      lexerror(ls,"lexical element too long",0);
    }
    sVar1 = raviX_buffer_size(mb);
    if (sVar1 == 0) {
      oldsize = 0x20;
    }
    else {
      oldsize = sVar1 << 1;
    }
    raviX_buffer_resize(mb,oldsize);
  }
  raviX_buffer_addc(mb,c);
  return;
}

Assistant:

static void save(LexerState *ls, int c)
{
	TextBuffer *b = ls->buff;
	if (raviX_buffer_len(b) + 1 > raviX_buffer_size(b)) {
		size_t newsize;
		if (raviX_buffer_size(b) >= INT_MAX / 2)
			lexerror(ls, "lexical element too long", 0);
		size_t oldsize = raviX_buffer_size(b);
		if (oldsize == 0)
			newsize = 32;
		else
			newsize = oldsize * 2;
		raviX_buffer_resize(b, newsize);
	}
	raviX_buffer_addc(b, c);
}